

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = protobuf::internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (iVar2 != 0) {
    ClearFallback(this);
  }
  bVar1 = MergeFromCodedStream(this,input);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::ParseFromCodedStream(io::CodedInputStream* input) {
  Clear();
  return MergeFromCodedStream(input);
}